

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.hpp
# Opt level: O1

CSharedMemoryObject *
CorUnix::InternalNew<CorUnix::CSharedMemoryObject,CorUnix::CObjectType*,_CRITICAL_SECTION*>
          (CObjectType *arg1,_CRITICAL_SECTION *arg2)

{
  CSharedMemoryObject *this;
  
  this = (CSharedMemoryObject *)InternalMalloc(0x1c8);
  if (this == (CSharedMemoryObject *)0x0) {
    this = (CSharedMemoryObject *)0x0;
  }
  else {
    CSharedMemoryObject::CSharedMemoryObject(this,arg1,arg2);
  }
  return this;
}

Assistant:

T* InternalNew(A1 arg1, A2 arg2)
    {
        INTERNAL_NEW_COMMON();
        return new (pMem) T(arg1, arg2);
    }